

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O2

void oonf_stream_copy_managed_config
               (oonf_stream_managed_config *dst,oonf_stream_managed_config *src)

{
  long lVar1;
  oonf_stream_managed_config *poVar2;
  oonf_stream_managed_config *poVar3;
  byte bVar4;
  
  bVar4 = 0;
  oonf_stream_free_managed_config(dst);
  poVar2 = src;
  poVar3 = dst;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    (poVar3->acl).accept = (poVar2->acl).accept;
    poVar2 = (oonf_stream_managed_config *)((long)poVar2 + (ulong)bVar4 * -0x10 + 8);
    poVar3 = (oonf_stream_managed_config *)((long)poVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  (dst->acl).reject = (netaddr *)0x0;
  (dst->acl).reject_count = 0;
  (dst->acl).accept = (netaddr *)0x0;
  (dst->acl).accept_count = 0;
  (dst->acl).reject_first = false;
  (dst->acl).accept_default = false;
  *(undefined6 *)&(dst->acl).field_0x22 = 0;
  netaddr_acl_copy(dst,src);
  (dst->bindto).accept = (netaddr *)0x0;
  (dst->bindto).accept_count = 0;
  (dst->bindto).reject_first = false;
  (dst->bindto).accept_default = false;
  *(undefined6 *)&(dst->bindto).field_0x22 = 0;
  (dst->bindto).reject = (netaddr *)0x0;
  (dst->bindto).reject_count = 0;
  netaddr_acl_copy(&dst->bindto,&src->bindto);
  return;
}

Assistant:

void
oonf_stream_copy_managed_config(struct oonf_stream_managed_config *dst, struct oonf_stream_managed_config *src) {
  oonf_stream_free_managed_config(dst);

  memcpy(dst, src, sizeof(*dst));

  memset(&dst->acl, 0, sizeof(dst->acl));
  netaddr_acl_copy(&dst->acl, &src->acl);

  memset(&dst->bindto, 0, sizeof(dst->bindto));
  netaddr_acl_copy(&dst->bindto, &src->bindto);
}